

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearObjectStatePdu.cpp
# Opt level: O2

void __thiscall DIS::LinearObjectStatePdu::~LinearObjectStatePdu(LinearObjectStatePdu *this)

{
  (this->super_SyntheticEnvironmentFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__LinearObjectStatePdu_001c2148;
  std::vector<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>::clear
            (&this->_linearSegmentParameters);
  std::vector<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>::~vector
            (&this->_linearSegmentParameters);
  ObjectType::~ObjectType(&this->_objectType);
  SimulationAddress::~SimulationAddress(&this->_receivingID);
  SimulationAddress::~SimulationAddress(&this->_requesterID);
  EntityID::~EntityID(&this->_referencedObjectID);
  EntityID::~EntityID(&this->_objectID);
  SyntheticEnvironmentFamilyPdu::~SyntheticEnvironmentFamilyPdu
            (&this->super_SyntheticEnvironmentFamilyPdu);
  return;
}

Assistant:

LinearObjectStatePdu::~LinearObjectStatePdu()
{
    _linearSegmentParameters.clear();
}